

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3InitVtab(int isCreate,sqlite3 *db,void *pAux,int argc,char **argv,sqlite3_vtab **ppVTab,
                char **pzErr)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  long lVar4;
  bool local_1c2;
  bool local_1c1;
  char *zMiss;
  char *zNot;
  int n_1;
  int n;
  char *z_1;
  int k;
  int j;
  Fts4Option *pOp;
  int iOpt;
  Fts4Option aFts4Opt [8];
  char *zVal;
  sqlite3_tokenizer_module *psStack_e8;
  int nKey;
  char *z;
  void *pvStack_d8;
  int nNotindexed;
  char **azNotindexed;
  char *zLanguageid;
  char *zContent;
  char *zUncompress;
  char *zCompress;
  char *zPrefix;
  int bDescIdx;
  int bNoDocsize;
  Fts3Index *aIndex;
  sqlite3_tokenizer *psStack_90;
  int nIndex;
  sqlite3_tokenizer *pTokenizer;
  char **aCol;
  int local_78;
  int isFts4;
  int nName;
  int nDb;
  char *zCsr;
  int local_60;
  int nCol;
  int nString;
  int iCol;
  sqlite3_int64 nByte;
  int i;
  int rc;
  Fts3Table *p;
  Fts3Hash *pHash;
  sqlite3_vtab **ppVTab_local;
  char **argv_local;
  void *pvStack_20;
  int argc_local;
  void *pAux_local;
  sqlite3 *db_local;
  int isCreate_local;
  
  _i = (Fts3Table *)0x0;
  nByte._4_4_ = 0;
  local_60 = 0;
  zCsr._4_4_ = 0;
  aCol._4_4_ = (uint)((*argv)[3] == '4');
  psStack_90 = (sqlite3_tokenizer *)0x0;
  aIndex._4_4_ = 0;
  _bDescIdx = (Fts3Index *)0x0;
  zPrefix._4_4_ = 0;
  zPrefix._0_4_ = 0;
  zCompress = (char *)0x0;
  zUncompress = (char *)0x0;
  zContent = (char *)0x0;
  zLanguageid = (char *)0x0;
  azNotindexed = (char **)0x0;
  pvStack_d8 = (void *)0x0;
  z._4_4_ = 0;
  p = (Fts3Table *)pAux;
  pHash = (Fts3Hash *)ppVTab;
  ppVTab_local = (sqlite3_vtab **)argv;
  argv_local._4_4_ = argc;
  pvStack_20 = pAux;
  pAux_local = db;
  db_local._4_4_ = isCreate;
  sVar2 = strlen(argv[1]);
  isFts4 = (int)sVar2 + 1;
  sVar2 = strlen((char *)ppVTab_local[2]);
  local_78 = (int)sVar2 + 1;
  _nString = (long)(argv_local._4_4_ + -2) << 3;
  pTokenizer = (sqlite3_tokenizer *)sqlite3_malloc64(_nString);
  if (pTokenizer != (sqlite3_tokenizer *)0x0) {
    memset(pTokenizer,0,_nString);
    pvStack_d8 = sqlite3_malloc64(_nString);
  }
  if (pvStack_d8 != (void *)0x0) {
    memset(pvStack_d8,0,_nString);
  }
  if ((pTokenizer == (sqlite3_tokenizer *)0x0) || (pvStack_d8 == (void *)0x0)) {
    nByte._4_4_ = 7;
  }
  else {
    for (nByte._0_4_ = 3; nByte._4_4_ == 0 && (int)nByte < argv_local._4_4_;
        nByte._0_4_ = (int)nByte + 1) {
      psStack_e8 = (sqlite3_tokenizer_module *)ppVTab_local[(int)nByte];
      if ((((psStack_90 == (sqlite3_tokenizer *)0x0) &&
           (sVar2 = strlen((char *)psStack_e8), 8 < sVar2)) &&
          (iVar1 = sqlite3_strnicmp((char *)psStack_e8,"tokenize",8), iVar1 == 0)) &&
         (iVar1 = sqlite3Fts3IsIdChar(*(char *)&psStack_e8->xCreate), iVar1 == 0)) {
        nByte._4_4_ = sqlite3Fts3InitTokenizer
                                ((Fts3Hash *)p,(char *)((long)&psStack_e8->xCreate + 1),
                                 &stack0xffffffffffffff70,pzErr);
      }
      else if ((aCol._4_4_ == 0) ||
              (iVar1 = fts3IsSpecialColumn((char *)psStack_e8,(int *)((long)&zVal + 4),
                                           (char **)&aFts4Opt[7].nOpt), iVar1 == 0)) {
        sVar2 = strlen((char *)psStack_e8);
        local_60 = (int)sVar2 + 1 + local_60;
        pTokenizer[zCsr._4_4_].pModule = psStack_e8;
        zCsr._4_4_ = zCsr._4_4_ + 1;
      }
      else {
        memcpy(&stack0xfffffffffffffe88,&PTR_anon_var_dwarf_1c0e8_0025a980,0x80);
        if (aFts4Opt[7]._8_8_ == 0) {
          nByte._4_4_ = 7;
        }
        else {
          for (pOp._4_4_ = 0; pOp._4_4_ < 8; pOp._4_4_ = pOp._4_4_ + 1) {
            lVar4 = (long)pOp._4_4_;
            _k = (undefined8 *)(&stack0xfffffffffffffe88 + lVar4 * 0x10);
            if ((zVal._4_4_ == *(int *)&aFts4Opt[lVar4].zOpt) &&
               (iVar1 = sqlite3_strnicmp((char *)psStack_e8,(char *)*_k,
                                         *(int *)&aFts4Opt[lVar4].zOpt), iVar1 == 0)) break;
          }
          switch(pOp._4_4_) {
          case 0:
            sVar2 = strlen((char *)aFts4Opt[7]._8_8_);
            if ((sVar2 != 4) ||
               (iVar1 = sqlite3_strnicmp((char *)aFts4Opt[7]._8_8_,"fts3",4), iVar1 != 0)) {
              sqlite3Fts3ErrMsg(pzErr,"unrecognized matchinfo: %s",aFts4Opt[7]._8_8_);
              nByte._4_4_ = 1;
            }
            zPrefix._4_4_ = 1;
            break;
          case 1:
            sqlite3_free(zCompress);
            zCompress = (char *)aFts4Opt[7]._8_8_;
            aFts4Opt[7].nOpt = 0;
            aFts4Opt[7]._12_4_ = 0;
            break;
          case 2:
            sqlite3_free(zUncompress);
            zUncompress = (char *)aFts4Opt[7]._8_8_;
            aFts4Opt[7].nOpt = 0;
            aFts4Opt[7]._12_4_ = 0;
            break;
          case 3:
            sqlite3_free(zContent);
            zContent = (char *)aFts4Opt[7]._8_8_;
            aFts4Opt[7].nOpt = 0;
            aFts4Opt[7]._12_4_ = 0;
            break;
          case 4:
            sVar2 = strlen((char *)aFts4Opt[7]._8_8_);
            if (((sVar2 != 3) ||
                (iVar1 = sqlite3_strnicmp((char *)aFts4Opt[7]._8_8_,"asc",3), iVar1 != 0)) &&
               ((sVar2 = strlen((char *)aFts4Opt[7]._8_8_), sVar2 != 4 ||
                (iVar1 = sqlite3_strnicmp((char *)aFts4Opt[7]._8_8_,"desc",4), iVar1 != 0)))) {
              sqlite3Fts3ErrMsg(pzErr,"unrecognized order: %s",aFts4Opt[7]._8_8_);
              nByte._4_4_ = 1;
            }
            local_1c1 = true;
            if (*(char *)aFts4Opt[7]._8_8_ != 'd') {
              local_1c1 = *(char *)aFts4Opt[7]._8_8_ == 'D';
            }
            zPrefix._0_4_ = (uint)local_1c1;
            break;
          case 5:
            sqlite3_free(zLanguageid);
            zLanguageid = (char *)aFts4Opt[7]._8_8_;
            aFts4Opt[7].nOpt = 0;
            aFts4Opt[7]._12_4_ = 0;
            break;
          case 6:
            sqlite3_free(azNotindexed);
            azNotindexed = (char **)aFts4Opt[7]._8_8_;
            aFts4Opt[7].nOpt = 0;
            aFts4Opt[7]._12_4_ = 0;
            break;
          case 7:
            *(undefined8 *)((long)pvStack_d8 + (long)z._4_4_ * 8) = aFts4Opt[7]._8_8_;
            aFts4Opt[7].nOpt = 0;
            aFts4Opt[7]._12_4_ = 0;
            z._4_4_ = z._4_4_ + 1;
            break;
          default:
            sqlite3Fts3ErrMsg(pzErr,"unrecognized parameter: %s",psStack_e8);
            nByte._4_4_ = 1;
          }
          sqlite3_free((void *)aFts4Opt[7]._8_8_);
        }
      }
    }
    if ((nByte._4_4_ == 0) && (zLanguageid != (char *)0x0)) {
      sqlite3_free(zUncompress);
      sqlite3_free(zContent);
      zUncompress = (char *)0x0;
      zContent = (char *)0x0;
      if (zCsr._4_4_ == 0) {
        sqlite3_free(pTokenizer);
        pTokenizer = (sqlite3_tokenizer *)0x0;
        nByte._4_4_ = fts3ContentColumns((sqlite3 *)pAux_local,(char *)ppVTab_local[1],zLanguageid,
                                         (char ***)&pTokenizer,(int *)((long)&zCsr + 4),&local_60,
                                         pzErr);
        if ((nByte._4_4_ == 0) && (azNotindexed != (char **)0x0)) {
          z_1._4_4_ = 0;
LAB_001fb7cd:
          if (z_1._4_4_ < zCsr._4_4_) {
            iVar1 = sqlite3_stricmp((char *)azNotindexed,(char *)pTokenizer[z_1._4_4_].pModule);
            if (iVar1 != 0) goto LAB_001fb854;
            for (z_1._0_4_ = z_1._4_4_; (int)z_1 < zCsr._4_4_; z_1._0_4_ = (int)z_1 + 1) {
              pTokenizer[(int)z_1].pModule = pTokenizer[(int)z_1 + 1].pModule;
            }
            zCsr._4_4_ = zCsr._4_4_ + -1;
          }
        }
      }
    }
    if (nByte._4_4_ == 0) {
      if (zCsr._4_4_ == 0) {
        pTokenizer->pModule = (sqlite3_tokenizer_module *)0x232f53;
        local_60 = 8;
        zCsr._4_4_ = 1;
      }
      if (psStack_90 == (sqlite3_tokenizer *)0x0) {
        nByte._4_4_ = sqlite3Fts3InitTokenizer
                                ((Fts3Hash *)p,"simple",&stack0xffffffffffffff70,pzErr);
        if (nByte._4_4_ != 0) goto LAB_001fbec6;
        nByte._4_4_ = 0;
      }
      nByte._4_4_ = fts3PrefixParameter(zCompress,(int *)((long)&aIndex + 4),(Fts3Index **)&bDescIdx
                                       );
      if (nByte._4_4_ == 1) {
        sqlite3Fts3ErrMsg(pzErr,"error parsing prefix parameter: %s",zCompress);
      }
      if (nByte._4_4_ == 0) {
        _nString = (long)zCsr._4_4_ * 8 + 0x208 + (long)aIndex._4_4_ * 0x28 + (long)zCsr._4_4_ +
                   (long)local_78 + (long)isFts4 + (long)local_60;
        _i = (Fts3Table *)sqlite3_malloc64(_nString);
        if (_i == (Fts3Table *)0x0) {
          nByte._4_4_ = 7;
        }
        else {
          memset(_i,0,_nString);
          _i->db = (sqlite3 *)pAux_local;
          _i->nColumn = zCsr._4_4_;
          _i->nPendingData = 0;
          _i->azColumn = (char **)(_i + 1);
          _i->pTokenizer = psStack_90;
          _i->nMaxPendingData = 0x100000;
          local_1c2 = aCol._4_4_ != 0 && zPrefix._4_4_ == 0;
          _i->bHasDocsize = local_1c2;
          _i->bHasStat = (u8)aCol._4_4_;
          _i->bFts4 = (u8)aCol._4_4_;
          _i->bDescIdx = (u8)(uint)zPrefix;
          _i->nAutoincrmerge = 0xff;
          _i->zContentTbl = zLanguageid;
          _i->zLanguageid = (char *)azNotindexed;
          zLanguageid = (char *)0x0;
          azNotindexed = (char **)0x0;
          _i->aIndex = (Fts3Index *)(_i->azColumn + zCsr._4_4_);
          memcpy(_i->aIndex,_bDescIdx,(long)aIndex._4_4_ * 0x28);
          _i->nIndex = aIndex._4_4_;
          for (nByte._0_4_ = 0; (int)nByte < aIndex._4_4_; nByte._0_4_ = (int)nByte + 1) {
            sqlite3Fts3HashInit(&_i->aIndex[(int)nByte].hPending,'\x01','\x01');
          }
          _i->abNotindexed = (u8 *)(_i->aIndex + aIndex._4_4_);
          _nName = _i->abNotindexed + zCsr._4_4_;
          _i->zName = (char *)_nName;
          memcpy(_nName,ppVTab_local[2],(long)local_78);
          _nName = _nName + local_78;
          _i->zDb = (char *)_nName;
          memcpy(_nName,ppVTab_local[1],(long)isFts4);
          _nName = _nName + isFts4;
          for (nCol = 0; nCol < zCsr._4_4_; nCol = nCol + 1) {
            zNot._4_4_ = 0;
            _n_1 = sqlite3Fts3NextToken((char *)pTokenizer[nCol].pModule,(int *)((long)&zNot + 4));
            if (0 < zNot._4_4_) {
              memcpy(_nName,_n_1,(long)zNot._4_4_);
            }
            _nName[zNot._4_4_] = '\0';
            sqlite3Fts3Dequote((char *)_nName);
            _i->azColumn[nCol] = (char *)_nName;
            _nName = _nName + (zNot._4_4_ + 1);
          }
          for (nCol = 0; nCol < zCsr._4_4_; nCol = nCol + 1) {
            sVar2 = strlen(_i->azColumn[nCol]);
            zNot._0_4_ = (int)sVar2;
            for (nByte._0_4_ = 0; iVar1 = (int)zNot, (int)nByte < z._4_4_;
                nByte._0_4_ = (int)nByte + 1) {
              pcVar3 = *(char **)((long)pvStack_d8 + (long)(int)nByte * 8);
              if (((pcVar3 != (char *)0x0) && (sVar2 = strlen(pcVar3), iVar1 == (int)sVar2)) &&
                 (iVar1 = sqlite3_strnicmp(_i->azColumn[nCol],pcVar3,(int)zNot), iVar1 == 0)) {
                _i->abNotindexed[nCol] = '\x01';
                sqlite3_free(pcVar3);
                *(undefined8 *)((long)pvStack_d8 + (long)(int)nByte * 8) = 0;
              }
            }
          }
          for (nByte._0_4_ = 0; (int)nByte < z._4_4_; nByte._0_4_ = (int)nByte + 1) {
            if (*(long *)((long)pvStack_d8 + (long)(int)nByte * 8) != 0) {
              sqlite3Fts3ErrMsg(pzErr,"no such column: %s",
                                *(undefined8 *)((long)pvStack_d8 + (long)(int)nByte * 8));
              nByte._4_4_ = 1;
            }
          }
          if ((nByte._4_4_ == 0) && ((zUncompress == (char *)0x0) != (zContent == (char *)0x0))) {
            pcVar3 = "uncompress";
            if (zUncompress == (char *)0x0) {
              pcVar3 = "compress";
            }
            nByte._4_4_ = 1;
            sqlite3Fts3ErrMsg(pzErr,"missing %s parameter in fts4 constructor",pcVar3);
          }
          pcVar3 = fts3ReadExprList(_i,zContent,(int *)((long)&nByte + 4));
          _i->zReadExprlist = pcVar3;
          pcVar3 = fts3WriteExprList(_i,zUncompress,(int *)((long)&nByte + 4));
          _i->zWriteExprlist = pcVar3;
          if (nByte._4_4_ == 0) {
            if (db_local._4_4_ != 0) {
              nByte._4_4_ = fts3CreateTables(_i);
            }
            if ((aCol._4_4_ == 0) && (db_local._4_4_ == 0)) {
              _i->bHasStat = '\x02';
            }
            fts3DatabasePageSize((int *)((long)&nByte + 4),_i);
            _i->nNodeSize = _i->nPgsz + -0x23;
            fts3DeclareVtab((int *)((long)&nByte + 4),_i);
          }
        }
      }
    }
  }
LAB_001fbec6:
  sqlite3_free(zCompress);
  sqlite3_free(_bDescIdx);
  sqlite3_free(zUncompress);
  sqlite3_free(zContent);
  sqlite3_free(zLanguageid);
  sqlite3_free(azNotindexed);
  for (nByte._0_4_ = 0; (int)nByte < z._4_4_; nByte._0_4_ = (int)nByte + 1) {
    sqlite3_free(*(void **)((long)pvStack_d8 + (long)(int)nByte * 8));
  }
  sqlite3_free(pTokenizer);
  sqlite3_free(pvStack_d8);
  if (nByte._4_4_ == 0) {
    *(Fts3Table **)pHash = _i;
  }
  else if (_i == (Fts3Table *)0x0) {
    if (psStack_90 != (sqlite3_tokenizer *)0x0) {
      (*psStack_90->pModule->xDestroy)(psStack_90);
    }
  }
  else {
    fts3DisconnectMethod(&_i->base);
  }
  return nByte._4_4_;
LAB_001fb854:
  z_1._4_4_ = z_1._4_4_ + 1;
  goto LAB_001fb7cd;
}

Assistant:

static int fts3InitVtab(
  int isCreate,                   /* True for xCreate, false for xConnect */
  sqlite3 *db,                    /* The SQLite database connection */
  void *pAux,                     /* Hash table containing tokenizers */
  int argc,                       /* Number of elements in argv array */
  const char * const *argv,       /* xCreate/xConnect argument array */
  sqlite3_vtab **ppVTab,          /* Write the resulting vtab structure here */
  char **pzErr                    /* Write any error message here */
){
  Fts3Hash *pHash = (Fts3Hash *)pAux;
  Fts3Table *p = 0;               /* Pointer to allocated vtab */
  int rc = SQLITE_OK;             /* Return code */
  int i;                          /* Iterator variable */
  sqlite3_int64 nByte;            /* Size of allocation used for *p */
  int iCol;                       /* Column index */
  int nString = 0;                /* Bytes required to hold all column names */
  int nCol = 0;                   /* Number of columns in the FTS table */
  char *zCsr;                     /* Space for holding column names */
  int nDb;                        /* Bytes required to hold database name */
  int nName;                      /* Bytes required to hold table name */
  int isFts4 = (argv[0][3]=='4'); /* True for FTS4, false for FTS3 */
  const char **aCol;              /* Array of column names */
  sqlite3_tokenizer *pTokenizer = 0;        /* Tokenizer for this table */

  int nIndex = 0;                 /* Size of aIndex[] array */
  struct Fts3Index *aIndex = 0;   /* Array of indexes for this table */

  /* The results of parsing supported FTS4 key=value options: */
  int bNoDocsize = 0;             /* True to omit %_docsize table */
  int bDescIdx = 0;               /* True to store descending indexes */
  char *zPrefix = 0;              /* Prefix parameter value (or NULL) */
  char *zCompress = 0;            /* compress=? parameter (or NULL) */
  char *zUncompress = 0;          /* uncompress=? parameter (or NULL) */
  char *zContent = 0;             /* content=? parameter (or NULL) */
  char *zLanguageid = 0;          /* languageid=? parameter (or NULL) */
  char **azNotindexed = 0;        /* The set of notindexed= columns */
  int nNotindexed = 0;            /* Size of azNotindexed[] array */

  assert( strlen(argv[0])==4 );
  assert( (sqlite3_strnicmp(argv[0], "fts4", 4)==0 && isFts4)
       || (sqlite3_strnicmp(argv[0], "fts3", 4)==0 && !isFts4)
  );

  nDb = (int)strlen(argv[1]) + 1;
  nName = (int)strlen(argv[2]) + 1;

  nByte = sizeof(const char *) * (argc-2);
  aCol = (const char **)sqlite3_malloc64(nByte);
  if( aCol ){
    memset((void*)aCol, 0, nByte);
    azNotindexed = (char **)sqlite3_malloc64(nByte);
  }
  if( azNotindexed ){
    memset(azNotindexed, 0, nByte);
  }
  if( !aCol || !azNotindexed ){
    rc = SQLITE_NOMEM;
    goto fts3_init_out;
  }

  /* Loop through all of the arguments passed by the user to the FTS3/4
  ** module (i.e. all the column names and special arguments). This loop
  ** does the following:
  **
  **   + Figures out the number of columns the FTSX table will have, and
  **     the number of bytes of space that must be allocated to store copies
  **     of the column names.
  **
  **   + If there is a tokenizer specification included in the arguments,
  **     initializes the tokenizer pTokenizer.
  */
  for(i=3; rc==SQLITE_OK && i<argc; i++){
    char const *z = argv[i];
    int nKey;
    char *zVal;

    /* Check if this is a tokenizer specification */
    if( !pTokenizer 
     && strlen(z)>8
     && 0==sqlite3_strnicmp(z, "tokenize", 8) 
     && 0==sqlite3Fts3IsIdChar(z[8])
    ){
      rc = sqlite3Fts3InitTokenizer(pHash, &z[9], &pTokenizer, pzErr);
    }

    /* Check if it is an FTS4 special argument. */
    else if( isFts4 && fts3IsSpecialColumn(z, &nKey, &zVal) ){
      struct Fts4Option {
        const char *zOpt;
        int nOpt;
      } aFts4Opt[] = {
        { "matchinfo",   9 },     /* 0 -> MATCHINFO */
        { "prefix",      6 },     /* 1 -> PREFIX */
        { "compress",    8 },     /* 2 -> COMPRESS */
        { "uncompress", 10 },     /* 3 -> UNCOMPRESS */
        { "order",       5 },     /* 4 -> ORDER */
        { "content",     7 },     /* 5 -> CONTENT */
        { "languageid", 10 },     /* 6 -> LANGUAGEID */
        { "notindexed", 10 }      /* 7 -> NOTINDEXED */
      };

      int iOpt;
      if( !zVal ){
        rc = SQLITE_NOMEM;
      }else{
        for(iOpt=0; iOpt<SizeofArray(aFts4Opt); iOpt++){
          struct Fts4Option *pOp = &aFts4Opt[iOpt];
          if( nKey==pOp->nOpt && !sqlite3_strnicmp(z, pOp->zOpt, pOp->nOpt) ){
            break;
          }
        }
        switch( iOpt ){
          case 0:               /* MATCHINFO */
            if( strlen(zVal)!=4 || sqlite3_strnicmp(zVal, "fts3", 4) ){
              sqlite3Fts3ErrMsg(pzErr, "unrecognized matchinfo: %s", zVal);
              rc = SQLITE_ERROR;
            }
            bNoDocsize = 1;
            break;

          case 1:               /* PREFIX */
            sqlite3_free(zPrefix);
            zPrefix = zVal;
            zVal = 0;
            break;

          case 2:               /* COMPRESS */
            sqlite3_free(zCompress);
            zCompress = zVal;
            zVal = 0;
            break;

          case 3:               /* UNCOMPRESS */
            sqlite3_free(zUncompress);
            zUncompress = zVal;
            zVal = 0;
            break;

          case 4:               /* ORDER */
            if( (strlen(zVal)!=3 || sqlite3_strnicmp(zVal, "asc", 3)) 
             && (strlen(zVal)!=4 || sqlite3_strnicmp(zVal, "desc", 4)) 
            ){
              sqlite3Fts3ErrMsg(pzErr, "unrecognized order: %s", zVal);
              rc = SQLITE_ERROR;
            }
            bDescIdx = (zVal[0]=='d' || zVal[0]=='D');
            break;

          case 5:              /* CONTENT */
            sqlite3_free(zContent);
            zContent = zVal;
            zVal = 0;
            break;

          case 6:              /* LANGUAGEID */
            assert( iOpt==6 );
            sqlite3_free(zLanguageid);
            zLanguageid = zVal;
            zVal = 0;
            break;

          case 7:              /* NOTINDEXED */
            azNotindexed[nNotindexed++] = zVal;
            zVal = 0;
            break;

          default:
            assert( iOpt==SizeofArray(aFts4Opt) );
            sqlite3Fts3ErrMsg(pzErr, "unrecognized parameter: %s", z);
            rc = SQLITE_ERROR;
            break;
        }
        sqlite3_free(zVal);
      }
    }

    /* Otherwise, the argument is a column name. */
    else {
      nString += (int)(strlen(z) + 1);
      aCol[nCol++] = z;
    }
  }

  /* If a content=xxx option was specified, the following:
  **
  **   1. Ignore any compress= and uncompress= options.
  **
  **   2. If no column names were specified as part of the CREATE VIRTUAL
  **      TABLE statement, use all columns from the content table.
  */
  if( rc==SQLITE_OK && zContent ){
    sqlite3_free(zCompress); 
    sqlite3_free(zUncompress); 
    zCompress = 0;
    zUncompress = 0;
    if( nCol==0 ){
      sqlite3_free((void*)aCol); 
      aCol = 0;
      rc = fts3ContentColumns(db, argv[1], zContent,&aCol,&nCol,&nString,pzErr);

      /* If a languageid= option was specified, remove the language id
      ** column from the aCol[] array. */ 
      if( rc==SQLITE_OK && zLanguageid ){
        int j;
        for(j=0; j<nCol; j++){
          if( sqlite3_stricmp(zLanguageid, aCol[j])==0 ){
            int k;
            for(k=j; k<nCol; k++) aCol[k] = aCol[k+1];
            nCol--;
            break;
          }
        }
      }
    }
  }
  if( rc!=SQLITE_OK ) goto fts3_init_out;

  if( nCol==0 ){
    assert( nString==0 );
    aCol[0] = "content";
    nString = 8;
    nCol = 1;
  }

  if( pTokenizer==0 ){
    rc = sqlite3Fts3InitTokenizer(pHash, "simple", &pTokenizer, pzErr);
    if( rc!=SQLITE_OK ) goto fts3_init_out;
  }
  assert( pTokenizer );

  rc = fts3PrefixParameter(zPrefix, &nIndex, &aIndex);
  if( rc==SQLITE_ERROR ){
    assert( zPrefix );
    sqlite3Fts3ErrMsg(pzErr, "error parsing prefix parameter: %s", zPrefix);
  }
  if( rc!=SQLITE_OK ) goto fts3_init_out;

  /* Allocate and populate the Fts3Table structure. */
  nByte = sizeof(Fts3Table) +                  /* Fts3Table */
          nCol * sizeof(char *) +              /* azColumn */
          nIndex * sizeof(struct Fts3Index) +  /* aIndex */
          nCol * sizeof(u8) +                  /* abNotindexed */
          nName +                              /* zName */
          nDb +                                /* zDb */
          nString;                             /* Space for azColumn strings */
  p = (Fts3Table*)sqlite3_malloc64(nByte);
  if( p==0 ){
    rc = SQLITE_NOMEM;
    goto fts3_init_out;
  }
  memset(p, 0, nByte);
  p->db = db;
  p->nColumn = nCol;
  p->nPendingData = 0;
  p->azColumn = (char **)&p[1];
  p->pTokenizer = pTokenizer;
  p->nMaxPendingData = FTS3_MAX_PENDING_DATA;
  p->bHasDocsize = (isFts4 && bNoDocsize==0);
  p->bHasStat = (u8)isFts4;
  p->bFts4 = (u8)isFts4;
  p->bDescIdx = (u8)bDescIdx;
  p->nAutoincrmerge = 0xff;   /* 0xff means setting unknown */
  p->zContentTbl = zContent;
  p->zLanguageid = zLanguageid;
  zContent = 0;
  zLanguageid = 0;
  TESTONLY( p->inTransaction = -1 );
  TESTONLY( p->mxSavepoint = -1 );

  p->aIndex = (struct Fts3Index *)&p->azColumn[nCol];
  memcpy(p->aIndex, aIndex, sizeof(struct Fts3Index) * nIndex);
  p->nIndex = nIndex;
  for(i=0; i<nIndex; i++){
    fts3HashInit(&p->aIndex[i].hPending, FTS3_HASH_STRING, 1);
  }
  p->abNotindexed = (u8 *)&p->aIndex[nIndex];

  /* Fill in the zName and zDb fields of the vtab structure. */
  zCsr = (char *)&p->abNotindexed[nCol];
  p->zName = zCsr;
  memcpy(zCsr, argv[2], nName);
  zCsr += nName;
  p->zDb = zCsr;
  memcpy(zCsr, argv[1], nDb);
  zCsr += nDb;

  /* Fill in the azColumn array */
  for(iCol=0; iCol<nCol; iCol++){
    char *z; 
    int n = 0;
    z = (char *)sqlite3Fts3NextToken(aCol[iCol], &n);
    if( n>0 ){
      memcpy(zCsr, z, n);
    }
    zCsr[n] = '\0';
    sqlite3Fts3Dequote(zCsr);
    p->azColumn[iCol] = zCsr;
    zCsr += n+1;
    assert( zCsr <= &((char *)p)[nByte] );
  }

  /* Fill in the abNotindexed array */
  for(iCol=0; iCol<nCol; iCol++){
    int n = (int)strlen(p->azColumn[iCol]);
    for(i=0; i<nNotindexed; i++){
      char *zNot = azNotindexed[i];
      if( zNot && n==(int)strlen(zNot)
       && 0==sqlite3_strnicmp(p->azColumn[iCol], zNot, n) 
      ){
        p->abNotindexed[iCol] = 1;
        sqlite3_free(zNot);
        azNotindexed[i] = 0;
      }
    }
  }
  for(i=0; i<nNotindexed; i++){
    if( azNotindexed[i] ){
      sqlite3Fts3ErrMsg(pzErr, "no such column: %s", azNotindexed[i]);
      rc = SQLITE_ERROR;
    }
  }

  if( rc==SQLITE_OK && (zCompress==0)!=(zUncompress==0) ){
    char const *zMiss = (zCompress==0 ? "compress" : "uncompress");
    rc = SQLITE_ERROR;
    sqlite3Fts3ErrMsg(pzErr, "missing %s parameter in fts4 constructor", zMiss);
  }
  p->zReadExprlist = fts3ReadExprList(p, zUncompress, &rc);
  p->zWriteExprlist = fts3WriteExprList(p, zCompress, &rc);
  if( rc!=SQLITE_OK ) goto fts3_init_out;

  /* If this is an xCreate call, create the underlying tables in the 
  ** database. TODO: For xConnect(), it could verify that said tables exist.
  */
  if( isCreate ){
    rc = fts3CreateTables(p);
  }

  /* Check to see if a legacy fts3 table has been "upgraded" by the
  ** addition of a %_stat table so that it can use incremental merge.
  */
  if( !isFts4 && !isCreate ){
    p->bHasStat = 2;
  }

  /* Figure out the page-size for the database. This is required in order to
  ** estimate the cost of loading large doclists from the database.  */
  fts3DatabasePageSize(&rc, p);
  p->nNodeSize = p->nPgsz-35;

  /* Declare the table schema to SQLite. */
  fts3DeclareVtab(&rc, p);

fts3_init_out:
  sqlite3_free(zPrefix);
  sqlite3_free(aIndex);
  sqlite3_free(zCompress);
  sqlite3_free(zUncompress);
  sqlite3_free(zContent);
  sqlite3_free(zLanguageid);
  for(i=0; i<nNotindexed; i++) sqlite3_free(azNotindexed[i]);
  sqlite3_free((void *)aCol);
  sqlite3_free((void *)azNotindexed);
  if( rc!=SQLITE_OK ){
    if( p ){
      fts3DisconnectMethod((sqlite3_vtab *)p);
    }else if( pTokenizer ){
      pTokenizer->pModule->xDestroy(pTokenizer);
    }
  }else{
    assert( p->pSegments==0 );
    *ppVTab = &p->base;
  }
  return rc;
}